

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::moveRowsNewBranch(tst_GenericModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  const_reference pQVar4;
  QModelIndex local_6e8;
  QModelIndex local_6d0;
  undefined1 local_6b8 [8];
  value_type args;
  qsizetype local_698;
  QSignalSpy *local_690;
  QSignalSpy *spy_4;
  QSignalSpy **__end1_4;
  QSignalSpy **__begin1_4;
  QSignalSpy *(*__range1_4) [2];
  QLatin1Char local_653;
  QChar local_652;
  QVariant local_650;
  QChar local_62e;
  QLatin1Char local_62b;
  QChar local_62a;
  QModelIndex local_628;
  QVariant local_610;
  QChar local_5ee;
  QLatin1Char local_5eb;
  QChar local_5ea;
  QModelIndex local_5e8;
  QVariant local_5d0;
  QChar local_5ae;
  QLatin1Char local_5ab;
  QChar local_5aa;
  QModelIndex local_5a8;
  QVariant local_590;
  QChar local_56e;
  QLatin1Char local_56b;
  QChar local_56a;
  QModelIndex local_568;
  QVariant local_550;
  QChar local_52e;
  QLatin1Char local_52b;
  QChar local_52a;
  QModelIndex local_528;
  QVariant local_510;
  QChar local_4ee;
  QLatin1Char local_4eb;
  QChar local_4ea;
  QModelIndex local_4e8;
  QVariant local_4d0;
  QChar local_4aa;
  QModelIndex local_4a8;
  QVariant local_490;
  QModelIndex local_470;
  QVariant local_458;
  QModelIndex local_438;
  QVariant local_420;
  QModelIndex local_400;
  QVariant local_3e8;
  QModelIndex local_3c8;
  QVariant local_3b0;
  QModelIndex local_390;
  QVariant local_378;
  undefined1 local_358 [24];
  QPersistentModelIndex local_340 [8];
  QPersistentModelIndex twoIndex;
  qint32 local_334;
  qsizetype local_330;
  QSignalSpy *local_328;
  QSignalSpy *spy_3;
  QSignalSpy **__end1_3;
  QSignalSpy **__begin1_3;
  QSignalSpy *(*__range1_3) [2];
  qsizetype local_300;
  QSignalSpy *local_2f8;
  QSignalSpy *spy_2;
  QSignalSpy **__end1_2;
  QSignalSpy **__begin1_2;
  QSignalSpy *(*__range1_2) [2];
  qsizetype local_2d0;
  QSignalSpy *local_2c8;
  QSignalSpy *spy_1;
  QSignalSpy **__end1_1;
  QSignalSpy **__begin1_1;
  QSignalSpy *(*__range1_1) [2];
  qsizetype local_2a0;
  QSignalSpy *local_298;
  QSignalSpy *spy;
  QSignalSpy **__end1;
  QSignalSpy **__begin1;
  QSignalSpy *(*__range1) [2];
  QVariant local_270;
  undefined1 local_250 [24];
  QVariant local_238;
  undefined1 local_218 [28];
  uint local_1fc;
  QSignalSpy *pQStack_1f8;
  int i;
  QSignalSpy *spyArr [2];
  undefined1 local_1e0 [8];
  QSignalSpy rowsMovedSpy;
  undefined1 local_158 [8];
  QSignalSpy rowsAboutToBeMovedSpy;
  undefined1 local_c0 [8];
  QModelIndex destIndex;
  undefined1 local_90 [8];
  QModelIndex parIndex;
  QModelIndex local_60;
  undefined1 local_38 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_38,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  QModelIndex::QModelIndex(&local_60);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  QModelIndex::QModelIndex((QModelIndex *)&parIndex.m);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x3);
  QModelIndex::QModelIndex((QModelIndex *)&destIndex.m);
  GenericModel::index((int)local_90,(int)&probe + 8,(QModelIndex *)0x1);
  QModelIndex::QModelIndex((QModelIndex *)&rowsAboutToBeMovedSpy.m_waiting);
  GenericModel::index((int)local_c0,(int)&probe + 8,(QModelIndex *)0x2);
  GenericModel::insertColumns((int)&probe + 8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_158,(QObject *)&probe.field_0x8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_158);
  bVar2 = QTest::qVerify(bVar1,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x712);
  if ((bVar2 & 1) == 0) {
    rowsMovedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)local_1e0,(QObject *)&probe.field_0x8,
               "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)local_1e0);
    bVar2 = QTest::qVerify(bVar1,"rowsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x714);
    if ((bVar2 & 1) == 0) {
      rowsMovedSpy._124_4_ = 1;
    }
    else {
      pQStack_1f8 = (QSignalSpy *)local_158;
      spyArr[0] = (QSignalSpy *)local_1e0;
      for (local_1fc = 0; (int)local_1fc < 6; local_1fc = local_1fc + 1) {
        GenericModel::index((int)local_218,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QVariant::QVariant(&local_238,local_1fc);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_218,(int)&local_238)
        ;
        QVariant::~QVariant(&local_238);
        GenericModel::index((int)local_250,(int)&probe + 8,(QModelIndex *)(ulong)local_1fc);
        QChar::QChar((QChar *)((long)&__range1 + 6),local_1fc + 0x61);
        QVariant::QVariant(&local_270,(QChar *)(ulong)__range1._6_2_);
        GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_250,(int)&local_270)
        ;
        QVariant::~QVariant(&local_270);
      }
      bVar2 = GenericModel::moveRows
                        ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                         (int)local_c0);
      bVar2 = QTest::qVerify((bool)(~bVar2 & 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, -1)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x71a);
      if ((bVar2 & 1) == 0) {
        rowsMovedSpy._124_4_ = 1;
      }
      else {
        spy = (QSignalSpy *)(spyArr + 1);
        __end1 = &stack0xfffffffffffffe08;
        __begin1 = __end1;
        for (; (QSignalSpy *)__end1 != spy; __end1 = __end1 + 1) {
          local_298 = *__end1;
          local_2a0 = QList<QList<QVariant>_>::count(&local_298->super_QList<QList<QVariant>_>);
          __range1_1._4_4_ = 0;
          bVar1 = QTest::qCompare<long_long,int>
                            (&local_2a0,(qint32 *)((long)&__range1_1 + 4),"spy->count()","0",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x71c);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            rowsMovedSpy._124_4_ = 1;
            goto LAB_0013a70b;
          }
        }
        bVar2 = GenericModel::moveRows
                          ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                           (int)local_c0);
        bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                               "!testModel.moveRows(parIndex, 2, 1, destIndex, 1)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x71d);
        if ((bVar2 & 1) == 0) {
          rowsMovedSpy._124_4_ = 1;
        }
        else {
          spy_1 = (QSignalSpy *)(spyArr + 1);
          __end1_1 = &stack0xfffffffffffffe08;
          __begin1_1 = __end1_1;
          for (; (QSignalSpy *)__end1_1 != spy_1; __end1_1 = __end1_1 + 1) {
            local_2c8 = *__end1_1;
            local_2d0 = QList<QList<QVariant>_>::count(&local_2c8->super_QList<QList<QVariant>_>);
            __range1_2._4_4_ = 0;
            bVar1 = QTest::qCompare<long_long,int>
                              (&local_2d0,(qint32 *)((long)&__range1_2 + 4),"spy->count()","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x71f);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              rowsMovedSpy._124_4_ = 1;
              goto LAB_0013a70b;
            }
          }
          bVar2 = GenericModel::moveRows
                            ((QModelIndex *)&probe.field_0x8,(int)local_90,-1,(QModelIndex *)0x1,
                             (int)local_c0);
          bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                 "!testModel.moveRows(parIndex, -1, 1, destIndex, 0)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x720);
          if ((bVar2 & 1) == 0) {
            rowsMovedSpy._124_4_ = 1;
          }
          else {
            spy_2 = (QSignalSpy *)(spyArr + 1);
            __end1_2 = &stack0xfffffffffffffe08;
            __begin1_2 = __end1_2;
            for (; (QSignalSpy *)__end1_2 != spy_2; __end1_2 = __end1_2 + 1) {
              local_2f8 = *__end1_2;
              local_300 = QList<QList<QVariant>_>::count(&local_2f8->super_QList<QList<QVariant>_>);
              __range1_3._4_4_ = 0;
              bVar1 = QTest::qCompare<long_long,int>
                                (&local_300,(qint32 *)((long)&__range1_3 + 4),"spy->count()","0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x722);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                rowsMovedSpy._124_4_ = 1;
                goto LAB_0013a70b;
              }
            }
            bVar2 = GenericModel::moveRows
                              ((QModelIndex *)&probe.field_0x8,(int)local_90,6,(QModelIndex *)0x1,
                               (int)local_c0);
            bVar2 = QTest::qVerify((bool)(~bVar2 & 1),
                                   "!testModel.moveRows(parIndex, 6, 1, destIndex, 0)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x723);
            if ((bVar2 & 1) == 0) {
              rowsMovedSpy._124_4_ = 1;
            }
            else {
              spy_3 = (QSignalSpy *)(spyArr + 1);
              __end1_3 = &stack0xfffffffffffffe08;
              __begin1_3 = __end1_3;
              for (; (QSignalSpy *)__end1_3 != spy_3; __end1_3 = __end1_3 + 1) {
                local_328 = *__end1_3;
                local_330 = QList<QList<QVariant>_>::count
                                      (&local_328->super_QList<QList<QVariant>_>);
                local_334 = 0;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_330,&local_334,"spy->count()","0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x725);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  rowsMovedSpy._124_4_ = 1;
                  goto LAB_0013a70b;
                }
              }
              GenericModel::index((int)local_358,(int)&probe + 8,(QModelIndex *)0x2);
              QPersistentModelIndex::QPersistentModelIndex(local_340,(QModelIndex *)local_358);
              bVar2 = GenericModel::moveRows
                                ((QModelIndex *)&probe.field_0x8,(int)local_90,2,(QModelIndex *)0x1,
                                 (int)local_c0);
              bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                     "testModel.moveRows(parIndex, 2, 1, destIndex, 0)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x728);
              if ((bVar2 & 1) == 0) {
                rowsMovedSpy._124_4_ = 1;
              }
              else {
                iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                bVar2 = QTest::qCompare(iVar3,1,"testModel.rowCount(destIndex)","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x729);
                if ((bVar2 & 1) == 0) {
                  rowsMovedSpy._124_4_ = 1;
                }
                else {
                  iVar3 = GenericModel::columnCount((QModelIndex *)&probe.field_0x8);
                  bVar2 = QTest::qCompare(iVar3,2,"testModel.columnCount(destIndex)","2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x72a);
                  if ((bVar2 & 1) == 0) {
                    rowsMovedSpy._124_4_ = 1;
                  }
                  else {
                    iVar3 = GenericModel::rowCount((QModelIndex *)&probe.field_0x8);
                    bVar2 = QTest::qCompare(iVar3,5,"testModel.rowCount(parIndex)","5",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x72b);
                    if ((bVar2 & 1) == 0) {
                      rowsMovedSpy._124_4_ = 1;
                    }
                    else {
                      GenericModel::index((int)&local_390,(int)&probe + 8,(QModelIndex *)0x0);
                      QModelIndex::data(&local_378,&local_390,0);
                      iVar3 = QVariant::toInt((bool *)&local_378);
                      bVar2 = QTest::qCompare(iVar3,2,
                                              "testModel.index(0, 0, destIndex).data().toInt()","2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x72c);
                      QVariant::~QVariant(&local_378);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        GenericModel::index((int)&local_3c8,(int)&probe + 8,(QModelIndex *)0x0);
                        QModelIndex::data(&local_3b0,&local_3c8,0);
                        iVar3 = QVariant::toInt((bool *)&local_3b0);
                        bVar2 = QTest::qCompare(iVar3,0,
                                                "testModel.index(0, 0, parIndex).data().toInt()","0"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x72d);
                        QVariant::~QVariant(&local_3b0);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          GenericModel::index((int)&local_400,(int)&probe + 8,(QModelIndex *)0x1);
                          QModelIndex::data(&local_3e8,&local_400,0);
                          iVar3 = QVariant::toInt((bool *)&local_3e8);
                          bVar2 = QTest::qCompare(iVar3,1,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x72e);
                          QVariant::~QVariant(&local_3e8);
                          if (((bVar2 ^ 0xff) & 1) == 0) {
                            GenericModel::index((int)&local_438,(int)&probe + 8,(QModelIndex *)0x2);
                            QModelIndex::data(&local_420,&local_438,0);
                            iVar3 = QVariant::toInt((bool *)&local_420);
                            bVar2 = QTest::qCompare(iVar3,3,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x72f);
                            QVariant::~QVariant(&local_420);
                            if (((bVar2 ^ 0xff) & 1) == 0) {
                              GenericModel::index((int)&local_470,(int)&probe + 8,(QModelIndex *)0x3
                                                 );
                              QModelIndex::data(&local_458,&local_470,0);
                              iVar3 = QVariant::toInt((bool *)&local_458);
                              bVar2 = QTest::qCompare(iVar3,4,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x730);
                              QVariant::~QVariant(&local_458);
                              if (((bVar2 ^ 0xff) & 1) == 0) {
                                GenericModel::index((int)&local_4a8,(int)&probe + 8,
                                                    (QModelIndex *)0x4);
                                QModelIndex::data(&local_490,&local_4a8,0);
                                iVar3 = QVariant::toInt((bool *)&local_490);
                                bVar2 = QTest::qCompare(iVar3,5,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x731);
                                QVariant::~QVariant(&local_490);
                                if (((bVar2 ^ 0xff) & 1) == 0) {
                                  GenericModel::index((int)&local_4e8,(int)&probe + 8,
                                                      (QModelIndex *)0x0);
                                  QModelIndex::data(&local_4d0,&local_4e8,0);
                                  local_4aa = QVariant::value<QChar>(&local_4d0);
                                  QLatin1Char::QLatin1Char(&local_4eb,'c');
                                  QChar::QChar(&local_4ea,local_4eb);
                                  bVar1 = QTest::qCompare<QChar,QChar>
                                                    (&local_4aa,&local_4ea,
                                                                                                          
                                                  "testModel.index(0, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x732);
                                  QVariant::~QVariant(&local_4d0);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    GenericModel::index((int)&local_528,(int)&probe + 8,
                                                        (QModelIndex *)0x0);
                                    QModelIndex::data(&local_510,&local_528,0);
                                    local_4ee = QVariant::value<QChar>(&local_510);
                                    QLatin1Char::QLatin1Char(&local_52b,'a');
                                    QChar::QChar(&local_52a,local_52b);
                                    bVar1 = QTest::qCompare<QChar,QChar>
                                                      (&local_4ee,&local_52a,
                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x733);
                                    QVariant::~QVariant(&local_510);
                                    if (((bVar1 ^ 0xffU) & 1) == 0) {
                                      GenericModel::index((int)&local_568,(int)&probe + 8,
                                                          (QModelIndex *)0x1);
                                      QModelIndex::data(&local_550,&local_568,0);
                                      local_52e = QVariant::value<QChar>(&local_550);
                                      QLatin1Char::QLatin1Char(&local_56b,'b');
                                      QChar::QChar(&local_56a,local_56b);
                                      bVar1 = QTest::qCompare<QChar,QChar>
                                                        (&local_52e,&local_56a,
                                                                                                                  
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x734);
                                      QVariant::~QVariant(&local_550);
                                      if (((bVar1 ^ 0xffU) & 1) == 0) {
                                        GenericModel::index((int)&local_5a8,(int)&probe + 8,
                                                            (QModelIndex *)0x2);
                                        QModelIndex::data(&local_590,&local_5a8,0);
                                        local_56e = QVariant::value<QChar>(&local_590);
                                        QLatin1Char::QLatin1Char(&local_5ab,'d');
                                        QChar::QChar(&local_5aa,local_5ab);
                                        bVar1 = QTest::qCompare<QChar,QChar>
                                                          (&local_56e,&local_5aa,
                                                                                                                      
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x735);
                                        QVariant::~QVariant(&local_590);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          GenericModel::index((int)&local_5e8,(int)&probe + 8,
                                                              (QModelIndex *)0x3);
                                          QModelIndex::data(&local_5d0,&local_5e8,0);
                                          local_5ae = QVariant::value<QChar>(&local_5d0);
                                          QLatin1Char::QLatin1Char(&local_5eb,'e');
                                          QChar::QChar(&local_5ea,local_5eb);
                                          bVar1 = QTest::qCompare<QChar,QChar>
                                                            (&local_5ae,&local_5ea,
                                                                                                                          
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x736);
                                          QVariant::~QVariant(&local_5d0);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            GenericModel::index((int)&local_628,(int)&probe + 8,
                                                                (QModelIndex *)0x4);
                                            QModelIndex::data(&local_610,&local_628,0);
                                            local_5ee = QVariant::value<QChar>(&local_610);
                                            QLatin1Char::QLatin1Char(&local_62b,'f');
                                            QChar::QChar(&local_62a,local_62b);
                                            bVar1 = QTest::qCompare<QChar,QChar>
                                                              (&local_5ee,&local_62a,
                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x737);
                                            QVariant::~QVariant(&local_610);
                                            if (((bVar1 ^ 0xffU) & 1) == 0) {
                                              QPersistentModelIndex::data((int)&local_650);
                                              local_62e = QVariant::value<QChar>(&local_650);
                                              QLatin1Char::QLatin1Char(&local_653,'c');
                                              QChar::QChar(&local_652,local_653);
                                              bVar1 = QTest::qCompare<QChar,QChar>
                                                                (&local_62e,&local_652,
                                                                 "twoIndex.data().value<QChar>()",
                                                                 "QChar(QLatin1Char(\'c\'))",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x738);
                                              QVariant::~QVariant(&local_650);
                                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                iVar3 = QPersistentModelIndex::row();
                                                bVar2 = QTest::qCompare(iVar3,0,"twoIndex.row()","0"
                                                                        ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x739);
                                                if ((bVar2 & 1) == 0) {
                                                  rowsMovedSpy._124_4_ = 1;
                                                }
                                                else {
                                                  QPersistentModelIndex::parent();
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&__range1_4,
                                                                     (QModelIndex *)local_c0,
                                                                     "twoIndex.parent()","destIndex"
                                                                     ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73a);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    spy_4 = (QSignalSpy *)(spyArr + 1);
                                                    __end1_4 = &stack0xfffffffffffffe08;
                                                    __begin1_4 = __end1_4;
                                                    for (; (QSignalSpy *)__end1_4 != spy_4;
                                                        __end1_4 = __end1_4 + 1) {
                                                      local_690 = *__end1_4;
                                                      local_698 = QList<QList<QVariant>_>::count
                                                                            (&local_690->
                                                                                                                                                            
                                                  super_QList<QList<QVariant>_>);
                                                  args.d.size._4_4_ = 1;
                                                  bVar1 = QTest::qCompare<long_long,int>
                                                                    (&local_698,
                                                                     (qint32 *)
                                                                     ((long)&args.d.size + 4),
                                                                     "spy->count()","1",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73c);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                    goto LAB_0013a6ff;
                                                  }
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)local_6b8,
                                                             &local_690->
                                                              super_QList<QList<QVariant>_>);
                                                  pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                               local_6b8,0);
                                                  QVariant::value<QModelIndex>(&local_6d0,pQVar4);
                                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    (&local_6d0,
                                                                     (QModelIndex *)local_90,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73e);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_6b8,1);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73f);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_6b8,2);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x740);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_6b8,3);
                                                    QVariant::value<QModelIndex>(&local_6e8,pQVar4);
                                                    bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                      (&local_6e8,
                                                                       (QModelIndex *)local_c0,
                                                                                                                                              
                                                  "args.at(3).value<QModelIndex>()","destIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x741);
                                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                                    pQVar4 = QList<QVariant>::at((QList<QVariant> *)
                                                                                 local_6b8,4);
                                                    iVar3 = QVariant::toInt((bool *)pQVar4);
                                                    bVar2 = QTest::qCompare(iVar3,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x742);
                                                  if ((bVar2 & 1) == 0) {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                  QList<QVariant>::~QList
                                                            ((QList<QVariant> *)local_6b8);
                                                  if (rowsMovedSpy._124_4_ != 0) goto LAB_0013a6ff;
                                                  }
                                                  rowsMovedSpy._124_4_ = 0;
                                                  }
                                                  else {
                                                    rowsMovedSpy._124_4_ = 1;
                                                  }
                                                }
                                              }
                                              else {
                                                rowsMovedSpy._124_4_ = 1;
                                              }
                                            }
                                            else {
                                              rowsMovedSpy._124_4_ = 1;
                                            }
                                          }
                                          else {
                                            rowsMovedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          rowsMovedSpy._124_4_ = 1;
                                        }
                                      }
                                      else {
                                        rowsMovedSpy._124_4_ = 1;
                                      }
                                    }
                                    else {
                                      rowsMovedSpy._124_4_ = 1;
                                    }
                                  }
                                  else {
                                    rowsMovedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  rowsMovedSpy._124_4_ = 1;
                                }
                              }
                              else {
                                rowsMovedSpy._124_4_ = 1;
                              }
                            }
                            else {
                              rowsMovedSpy._124_4_ = 1;
                            }
                          }
                          else {
                            rowsMovedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          rowsMovedSpy._124_4_ = 1;
                        }
                      }
                      else {
                        rowsMovedSpy._124_4_ = 1;
                      }
                    }
                  }
                }
              }
LAB_0013a6ff:
              QPersistentModelIndex::~QPersistentModelIndex(local_340);
            }
          }
        }
      }
    }
LAB_0013a70b:
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_1e0);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_158);
  ModelTest::~ModelTest((ModelTest *)local_38);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsNewBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    const QModelIndex destIndex = testModel.index(2, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    for (int i = 0; i < 6; ++i) {
        testModel.setData(testModel.index(i, 0, parIndex), i);
        testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
    }
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, destIndex, 0));
    QCOMPARE(testModel.rowCount(destIndex), 1);
    QCOMPARE(testModel.columnCount(destIndex), 2);
    QCOMPARE(testModel.rowCount(parIndex), 5);
    QCOMPARE(testModel.index(0, 0, destIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    QCOMPARE(twoIndex.parent(), destIndex);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), destIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }
}